

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O0

int check_terrain_mastery(CHAR_DATA *ch)

{
  bool bVar1;
  int iVar2;
  long in_RDI;
  float fVar3;
  float sect_per;
  int total;
  int skill;
  int i;
  int in_stack_000000b4;
  bool in_stack_000000bb;
  int in_stack_000000bc;
  CHAR_DATA *in_stack_000000c0;
  int in_stack_000000dc;
  CHAR_DATA *in_stack_000000e0;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int sn;
  undefined4 local_1c;
  undefined4 local_14;
  undefined4 local_4;
  
  local_1c = 0;
  sn = 0;
  bVar1 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if (bVar1) {
    local_4 = 0;
  }
  else {
    iVar2 = get_skill(in_stack_000000e0,in_stack_000000dc);
    if (iVar2 < 1) {
      local_4 = 0;
    }
    else {
      bVar1 = style_check(sn,in_stack_ffffffffffffffdc);
      if (bVar1) {
        for (local_14 = 1; local_14 < 0x15; local_14 = local_14 + 1) {
          local_1c = local_1c +
                     (int)*(undefined8 *)(*(long *)(in_RDI + 0xc0) + 0xc10 + (long)local_14 * 8);
        }
        if (local_1c == 0) {
          local_4 = 0;
        }
        else {
          fVar3 = ((float)*(long *)(*(long *)(in_RDI + 0xc0) + 0xc10 +
                                   (long)*(short *)(*(long *)(in_RDI + 0xa8) + 0x150) * 8) /
                  (float)local_1c) * 100.0;
          check_improve(in_stack_000000c0,in_stack_000000bc,in_stack_000000bb,in_stack_000000b4);
          local_4 = (int)(fVar3 / ((float)(int)*(short *)(in_RDI + 0x274) * -0.36 + 10.0));
        }
      }
      else {
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

int check_terrain_mastery(CHAR_DATA *ch)
{
	int i, skill, total = 0;
	float sect_per = 0;

	if (is_npc(ch))
		return 0;

	skill = get_skill(ch, gsn_terrain_mastery);

	if (skill > 0)
	{
		if (!style_check(gsn_terrain_mastery, ch->pcdata->style))
			return 0;

		for (i = 1; i < SECT_MAX; i++)
		{
			total += ch->pcdata->sect_time[i];
		}

		if (total == 0)
			return 0;

		sect_per = (float)(ch->pcdata->sect_time[ch->in_room->sector_type]) / (float)total * 100;

		check_improve(ch, gsn_terrain_mastery, true, 4);
		return (int)(sect_per / (10 - 0.36 * (ch->mod_stat[STAT_INT])));
	}

	return 0;
}